

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

void sha1ProcessChunk(Sha1State *state,uchar *buffer)

{
  uint uVar1;
  void *in_RSI;
  quint32 *in_RDI;
  long in_FS_OFFSET;
  int i;
  Sha1Chunk *chunk;
  quint32 e;
  quint32 d;
  quint32 c;
  quint32 b;
  quint32 a;
  quint8 chunkBuffer [64];
  quint32 *in_stack_ffffffffffffff50;
  quint32 *w;
  quint32 *v;
  quint32 *y;
  uint position;
  Sha1Chunk *chunk_00;
  undefined4 in_stack_ffffffffffffff80;
  int iVar2;
  quint32 local_5c;
  Sha1Chunk local_58;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.words[3] = *in_RDI;
  local_58.words[2] = in_RDI[1];
  local_58.words[1] = in_RDI[2];
  local_58.words[0] = in_RDI[3];
  local_5c = in_RDI[4];
  memset(local_58.bytes + 0x10,0xaa,0x40);
  memcpy(local_58.bytes + 0x10,in_RSI,0x40);
  for (iVar2 = 0; iVar2 < 0x10; iVar2 = iVar2 + 1) {
    uVar1 = qFromBigEndian<unsigned_int>(0);
    *(uint *)((long)&local_58 + (long)iVar2 * 4 + 0x10) = uVar1;
  }
  w = local_58.words + 3;
  v = local_58.words + 2;
  y = (quint32 *)((long)&local_58 + 4);
  chunk_00 = &local_58;
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round0(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round1(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round1(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round1(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round1(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round2(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round3(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,&local_5c,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,(quint32 *)chunk_00,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,(uint)((ulong)y >> 0x20),v,w,in_stack_ffffffffffffff50,y,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  position = (uint)((ulong)y >> 0x20);
  sha1Round4(chunk_00,position,v,w,in_stack_ffffffffffffff50,v,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  sha1Round4(chunk_00,position,v,w,in_stack_ffffffffffffff50,w,
             (quint32 *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
  *in_RDI = *in_RDI + local_58.words[3];
  in_RDI[1] = in_RDI[1] + local_58.words[2];
  in_RDI[2] = in_RDI[2] + local_58.words[1];
  in_RDI[3] = in_RDI[3] + local_58.words[0];
  in_RDI[4] = in_RDI[4] + local_5c;
  local_5c = 0;
  local_58.words[0] = 0;
  local_58.words[1] = 0;
  local_58.words[2] = 0;
  local_58.words[3] = 0;
  local_18 = 0;
  uStack_10 = 0;
  local_58._48_8_ = 0;
  local_58._56_8_ = 0;
  local_58._32_8_ = 0;
  local_58._40_8_ = 0;
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void sha1ProcessChunk(Sha1State *state, const unsigned char *buffer)
{
    // Copy state[] to working vars
    quint32 a = state->h0;
    quint32 b = state->h1;
    quint32 c = state->h2;
    quint32 d = state->h3;
    quint32 e = state->h4;

    quint8 chunkBuffer[64];
    memcpy(chunkBuffer, buffer, 64);

    Sha1Chunk *chunk = reinterpret_cast<Sha1Chunk*>(&chunkBuffer);

    for (int i = 0; i < 16; ++i)
        chunk->words[i] = qFromBigEndian(chunk->words[i]);

    sha1Round0(chunk,  0, a,b,c,d,e); sha1Round0(chunk,  1, e,a,b,c,d); sha1Round0(chunk,  2, d,e,a,b,c); sha1Round0(chunk,  3, c,d,e,a,b);
    sha1Round0(chunk,  4, b,c,d,e,a); sha1Round0(chunk,  5, a,b,c,d,e); sha1Round0(chunk,  6, e,a,b,c,d); sha1Round0(chunk,  7, d,e,a,b,c);
    sha1Round0(chunk,  8, c,d,e,a,b); sha1Round0(chunk,  9, b,c,d,e,a); sha1Round0(chunk, 10, a,b,c,d,e); sha1Round0(chunk, 11, e,a,b,c,d);
    sha1Round0(chunk, 12, d,e,a,b,c); sha1Round0(chunk, 13, c,d,e,a,b); sha1Round0(chunk, 14, b,c,d,e,a); sha1Round0(chunk, 15, a,b,c,d,e);
    sha1Round1(chunk, 16, e,a,b,c,d); sha1Round1(chunk, 17, d,e,a,b,c); sha1Round1(chunk, 18, c,d,e,a,b); sha1Round1(chunk, 19, b,c,d,e,a);
    sha1Round2(chunk, 20, a,b,c,d,e); sha1Round2(chunk, 21, e,a,b,c,d); sha1Round2(chunk, 22, d,e,a,b,c); sha1Round2(chunk, 23, c,d,e,a,b);
    sha1Round2(chunk, 24, b,c,d,e,a); sha1Round2(chunk, 25, a,b,c,d,e); sha1Round2(chunk, 26, e,a,b,c,d); sha1Round2(chunk, 27, d,e,a,b,c);
    sha1Round2(chunk, 28, c,d,e,a,b); sha1Round2(chunk, 29, b,c,d,e,a); sha1Round2(chunk, 30, a,b,c,d,e); sha1Round2(chunk, 31, e,a,b,c,d);
    sha1Round2(chunk, 32, d,e,a,b,c); sha1Round2(chunk, 33, c,d,e,a,b); sha1Round2(chunk, 34, b,c,d,e,a); sha1Round2(chunk, 35, a,b,c,d,e);
    sha1Round2(chunk, 36, e,a,b,c,d); sha1Round2(chunk, 37, d,e,a,b,c); sha1Round2(chunk, 38, c,d,e,a,b); sha1Round2(chunk, 39, b,c,d,e,a);
    sha1Round3(chunk, 40, a,b,c,d,e); sha1Round3(chunk, 41, e,a,b,c,d); sha1Round3(chunk, 42, d,e,a,b,c); sha1Round3(chunk, 43, c,d,e,a,b);
    sha1Round3(chunk, 44, b,c,d,e,a); sha1Round3(chunk, 45, a,b,c,d,e); sha1Round3(chunk, 46, e,a,b,c,d); sha1Round3(chunk, 47, d,e,a,b,c);
    sha1Round3(chunk, 48, c,d,e,a,b); sha1Round3(chunk, 49, b,c,d,e,a); sha1Round3(chunk, 50, a,b,c,d,e); sha1Round3(chunk, 51, e,a,b,c,d);
    sha1Round3(chunk, 52, d,e,a,b,c); sha1Round3(chunk, 53, c,d,e,a,b); sha1Round3(chunk, 54, b,c,d,e,a); sha1Round3(chunk, 55, a,b,c,d,e);
    sha1Round3(chunk, 56, e,a,b,c,d); sha1Round3(chunk, 57, d,e,a,b,c); sha1Round3(chunk, 58, c,d,e,a,b); sha1Round3(chunk, 59, b,c,d,e,a);
    sha1Round4(chunk, 60, a,b,c,d,e); sha1Round4(chunk, 61, e,a,b,c,d); sha1Round4(chunk, 62, d,e,a,b,c); sha1Round4(chunk, 63, c,d,e,a,b);
    sha1Round4(chunk, 64, b,c,d,e,a); sha1Round4(chunk, 65, a,b,c,d,e); sha1Round4(chunk, 66, e,a,b,c,d); sha1Round4(chunk, 67, d,e,a,b,c);
    sha1Round4(chunk, 68, c,d,e,a,b); sha1Round4(chunk, 69, b,c,d,e,a); sha1Round4(chunk, 70, a,b,c,d,e); sha1Round4(chunk, 71, e,a,b,c,d);
    sha1Round4(chunk, 72, d,e,a,b,c); sha1Round4(chunk, 73, c,d,e,a,b); sha1Round4(chunk, 74, b,c,d,e,a); sha1Round4(chunk, 75, a,b,c,d,e);
    sha1Round4(chunk, 76, e,a,b,c,d); sha1Round4(chunk, 77, d,e,a,b,c); sha1Round4(chunk, 78, c,d,e,a,b); sha1Round4(chunk, 79, b,c,d,e,a);

    // Add the working vars back into state
    state->h0 += a;
    state->h1 += b;
    state->h2 += c;
    state->h3 += d;
    state->h4 += e;

    // Wipe variables
#ifdef SHA1_WIPE_VARIABLES
    a = b = c = d = e = 0;
    memset(chunkBuffer, 0, 64);
#endif
}